

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

bool __thiscall GF2::WW<127UL>::IsAll(WW<127UL> *this,bool val)

{
  word *pwVar1;
  bool bVar2;
  word wVar3;
  long lVar4;
  undefined3 in_register_00000031;
  
  bVar2 = true;
  lVar4 = 0;
  do {
    pwVar1 = this->_words + lVar4;
    if (!bVar2) {
      wVar3 = 0x7fffffffffffffff;
      if (!val) {
        wVar3 = 0;
      }
      return *pwVar1 == wVar3;
    }
    lVar4 = 1;
    bVar2 = false;
  } while (*pwVar1 == -(ulong)CONCAT31(in_register_00000031,val));
  return false;
}

Assistant:

bool IsAll(bool val) const
	{
		// проверить все слова представления, кроме последнего
		word w = val ? WORD_MAX : 0;
		size_t pos = 0;
        for (; pos + 1 < _wcount; pos++)
			if (_words[pos] != w) 
				return false;
		// проверить последнее слово представления
		return _words[pos] == (w << _tcount >> _tcount);
	}